

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

string * __thiscall
despot::ChainState::text_abi_cxx11_(string *__return_storage_ptr__,ChainState *this)

{
  void *this_00;
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  int local_1a8;
  int local_1a4;
  int s2;
  int a;
  int s1;
  ostringstream local_190 [8];
  ostringstream oss;
  ChainState *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = (void *)std::ostream::operator<<(local_190,this->mdp_state);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  s2 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            ::size(&this->mdp_transitions_);
    if (sVar1 <= (ulong)(long)s2) break;
    local_1a4 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->mdp_transitions_,(long)s2);
      sVar1 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(pvVar2);
      if (sVar1 <= (ulong)(long)local_1a4) break;
      poVar3 = (ostream *)std::ostream::operator<<(local_190,s2);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a4);
      std::operator<<(poVar3," ->");
      local_1a8 = 0;
      while( true ) {
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->mdp_transitions_,(long)s2);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar2,(long)local_1a4);
        sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        if (sVar1 <= (ulong)(long)local_1a8) break;
        poVar3 = std::operator<<((ostream *)local_190," ");
        pvVar2 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->mdp_transitions_,(long)s2);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar2,(long)local_1a4);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_1a8);
        std::ostream::operator<<(poVar3,*pvVar5);
        local_1a8 = local_1a8 + 1;
      }
      std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
      local_1a4 = local_1a4 + 1;
    }
    s2 = s2 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string ChainState::text() const {
	ostringstream oss;
	oss << mdp_state << endl;
	for (int s1 = 0; s1 < mdp_transitions_.size(); s1++) {
		for (int a = 0; a < mdp_transitions_[s1].size(); a++) {
			oss << s1 << " " << a << " ->";
			for (int s2 = 0; s2 < mdp_transitions_[s1][a].size(); s2++)
				oss << " " << mdp_transitions_[s1][a][s2];
			oss << endl;
		}
	}
	return oss.str();
}